

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compareBaseIncomparableUnitsWithInputAsNullptr_Test::TestBody
          (Units_compareBaseIncomparableUnitsWithInputAsNullptr_Test *this)

{
  element_type *peVar1;
  byte bVar2;
  allocator<char> aaStack_78 [8];
  allocator<char> local_70 [8];
  AssertionResult local_68 [2];
  UnitsPtr u;
  AssertionResult gtest_ar_;
  
  libcellml::Units::create();
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"u",(allocator<char> *)&gtest_ar_);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"milli",local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",aaStack_78);
  libcellml::Units::addUnit
            ((StandardUnit)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,(string *)0x10,1.0,1.0,(string *)local_68);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_68);
  local_68[0]._0_8_ = (char *)0x0;
  local_68[0].message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar2 = libcellml::Units::compatible((shared_ptr *)&u,(shared_ptr *)local_68);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68[0].message_);
  if (bVar2 != 0) {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_68,&gtest_ar_.success_,"libcellml::Units::compatible(u, nullptr)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)aaStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x656,(char *)local_68[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)aaStack_78,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)aaStack_78);
    std::__cxx11::string::~string((string *)local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_68[0]._0_8_ = (char *)0x0;
  local_68[0].message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar2 = libcellml::Units::compatible((shared_ptr *)local_68,(shared_ptr *)&u);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68[0].message_);
  if (bVar2 != 0) {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_68,&gtest_ar_.success_,"libcellml::Units::compatible(nullptr, u)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)aaStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x657,(char *)local_68[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)aaStack_78,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)aaStack_78);
    std::__cxx11::string::~string((string *)local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, compareBaseIncomparableUnitsWithInputAsNullptr)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit(libcellml::Units::StandardUnit::LUX, "milli");

    EXPECT_FALSE(libcellml::Units::compatible(u, nullptr));
    EXPECT_FALSE(libcellml::Units::compatible(nullptr, u));
}